

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O0

EStatusCode __thiscall
Type1ToType2Converter::Type1VMoveto(Type1ToType2Converter *this,LongList *inOperandList)

{
  size_type sVar1;
  Trace *this_00;
  LongList *inOperandList_local;
  Type1ToType2Converter *this_local;
  
  sVar1 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
  if (sVar1 == 0) {
    this_00 = Trace::DefaultTrace();
    sVar1 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
    Trace::TraceToLog(this_00,
                      "Type1ToType2Converter::Type1VMoveto, vmoveto expecting 1 argument, got %d. aborting."
                      ,sVar1);
    this_local._4_4_ = eFailure;
  }
  else {
    this->mFirstPathConstructionEncountered = true;
    this_local._4_4_ = RecordOperatorWithParameters(this,4,inOperandList);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1ToType2Converter::Type1VMoveto(const LongList& inOperandList)
{
	if(inOperandList.size() < 1) {
		TRACE_LOG1("Type1ToType2Converter::Type1VMoveto, vmoveto expecting 1 argument, got %d. aborting.", inOperandList.size());
		return eFailure;
	}

	mFirstPathConstructionEncountered = true;
	return RecordOperatorWithParameters(4,inOperandList);
}